

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O0

void CB_ADF::output_rank_example(vw *all,cb_adf *c,example *ec,multi_ex *ec_seq)

{
  undefined4 uVar1;
  int *piVar2;
  code *pcVar3;
  bool bVar4;
  _Ios_Openmode _Var5;
  v_array<int> *this;
  int **ppiVar6;
  size_t sVar7;
  cb_class *pcVar8;
  ostream *poVar9;
  long in_RDX;
  long in_RDI;
  size_t i;
  stringstream outputStringStream;
  string outputString;
  int sink;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  bool labeled_example;
  v_array<CB::cb_class> costs;
  label *ld;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  multi_ex *in_stack_fffffffffffffd58;
  example *in_stack_fffffffffffffd60;
  cb_adf *in_stack_fffffffffffffd68;
  vw *in_stack_fffffffffffffd70;
  ulong uVar10;
  string local_250 [32];
  ulong local_230;
  stringstream local_218 [16];
  ostream local_208;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  v_array<ACTION_SCORE::action_score> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int *local_60;
  v_array<CB::cb_class> local_48;
  undefined8 *local_28;
  long local_8;
  
  local_28 = (undefined8 *)(in_RDX + 0x6828);
  local_48._begin = (cb_class *)*local_28;
  local_48._end = *(cb_class **)(in_RDX + 0x6830);
  local_48.end_array = *(cb_class **)(in_RDX + 0x6838);
  local_48.erase_count = *(size_t *)(in_RDX + 0x6840);
  local_8 = in_RDI;
  bVar4 = CB_ALGS::example_is_newline_not_header
                    ((example *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  if (!bVar4) {
    update_statistics(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                      in_stack_fffffffffffffd58);
    this = (v_array<int> *)(local_8 + 0x3510);
    ppiVar6 = v_array<int>::begin(this);
    local_60 = *ppiVar6;
    ppiVar6 = v_array<int>::end(this);
    piVar2 = *ppiVar6;
    for (; local_60 != piVar2; local_60 = local_60 + 1) {
      in_stack_ffffffffffffff94 = *local_60;
      ACTION_SCORE::print_action_score
                (in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                 (v_array<char> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    }
    if (0 < *(int *)(local_8 + 0x3530)) {
      std::__cxx11::string::string((string *)&stack0xffffffffffffff70);
      _Var5 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_218,(string *)&stack0xffffffffffffff70,_Var5);
      local_230 = 0;
      while (uVar10 = local_230, sVar7 = v_array<CB::cb_class>::size(&local_48), uVar10 < sVar7) {
        if (local_230 != 0) {
          std::operator<<(&local_208,' ');
        }
        poVar9 = &local_208;
        pcVar8 = v_array<CB::cb_class>::operator[](&local_48,local_230);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,pcVar8->action);
        poVar9 = std::operator<<(poVar9,':');
        pcVar8 = v_array<CB::cb_class>::operator[](&local_48,local_230);
        std::ostream::operator<<(poVar9,pcVar8->partial_prediction);
        local_230 = local_230 + 1;
      }
      pcVar3 = *(code **)(local_8 + 0x3540);
      uVar1 = *(undefined4 *)(local_8 + 0x3530);
      std::__cxx11::stringstream::str();
      (*pcVar3)(uVar1,local_250);
      std::__cxx11::string::~string(local_250);
      std::__cxx11::stringstream::~stringstream(local_218);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    }
    CB::print_update((vw *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (bool)in_stack_ffffffffffffff8f,
                     (example *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (multi_ex *)in_stack_ffffffffffffff78,(bool)in_stack_ffffffffffffff77);
  }
  return;
}

Assistant:

void output_rank_example(vw& all, cb_adf& c, example& ec, multi_ex* ec_seq)
{
  label& ld = ec.l.cb;
  v_array<CB::cb_class> costs = ld.costs;

  if (example_is_newline_not_header(ec))
    return;

  bool labeled_example = update_statistics(all, c, ec, ec_seq);

  for (int sink : all.final_prediction_sink) print_action_score(sink, ec.pred.a_s, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].action << ':' << costs[i].partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  CB::print_update(all, !labeled_example, ec, ec_seq, true);
}